

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O3

uint32_t __thiscall choc::value::ValueView::size(ValueView *this)

{
  MainType MVar1;
  ComplexArray *pCVar2;
  uint32_t uVar3;
  ulong uVar4;
  long lVar5;
  
  MVar1 = (this->type).mainType;
  uVar4 = (ulong)(MVar1 - 1);
  if (MVar1 - 1 < 0x40) {
    if ((0x800880089U >> (uVar4 & 0x3f) & 1) != 0) {
      return 1;
    }
    if ((uVar4 == 0x2f) || (uVar4 == 0x3f)) {
      return (this->type).content.vector.numElements;
    }
  }
  if (MVar1 == complexArray) {
    pCVar2 = (this->type).content.complexArray;
    uVar4 = (ulong)(pCVar2->groups).size;
    if (uVar4 == 0) {
      uVar3 = 0;
    }
    else {
      lVar5 = 0;
      uVar3 = 0;
      do {
        uVar3 = uVar3 + *(int *)((long)&((pCVar2->groups).items)->repetitions + lVar5);
        lVar5 = lVar5 + 0x28;
      } while (uVar4 * 0x28 != lVar5);
    }
  }
  else {
    if (MVar1 != object) {
      throwError("This type doesn\'t have sub-elements");
    }
    uVar3 = (((this->type).content.object)->members).size;
  }
  return uVar3;
}

Assistant:

inline uint32_t ValueView::size() const             { return type.getNumElements(); }